

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O0

bool __thiscall leveldb::Block::Iter::ParseNextKey(Iter *this)

{
  uint32_t uVar1;
  ulong uVar2;
  bool bVar3;
  Slice local_48;
  uint local_34;
  uint local_30;
  uint32_t value_length;
  uint32_t non_shared;
  uint32_t shared;
  char *limit;
  char *p;
  Iter *this_local;
  
  p = (char *)this;
  uVar1 = NextEntryOffset(this);
  this->current_ = uVar1;
  limit = this->data_ + this->current_;
  _non_shared = this->data_ + this->restarts_;
  if (limit < _non_shared) {
    limit = DecodeEntry(limit,_non_shared,&value_length,&local_30,&local_34);
    if ((limit != (char *)0x0) && (uVar2 = std::__cxx11::string::size(), value_length <= uVar2)) {
      std::__cxx11::string::resize((ulong)&this->key_);
      std::__cxx11::string::append((char *)&this->key_,(ulong)limit);
      Slice::Slice(&local_48,limit + local_30,(ulong)local_34);
      (this->value_).data_ = local_48.data_;
      (this->value_).size_ = local_48.size_;
      while( true ) {
        bVar3 = false;
        if (this->restart_index_ + 1 < this->num_restarts_) {
          uVar1 = GetRestartPoint(this,this->restart_index_ + 1);
          bVar3 = uVar1 < this->current_;
        }
        if (!bVar3) break;
        this->restart_index_ = this->restart_index_ + 1;
      }
      return true;
    }
    CorruptionError(this);
  }
  else {
    this->current_ = this->restarts_;
    this->restart_index_ = this->num_restarts_;
  }
  return false;
}

Assistant:

bool ParseNextKey() {
    current_ = NextEntryOffset();
    const char* p = data_ + current_;
    const char* limit = data_ + restarts_;  // Restarts come right after data
    if (p >= limit) {
      // No more entries to return.  Mark as invalid.
      current_ = restarts_;
      restart_index_ = num_restarts_;
      return false;
    }

    // Decode next entry
    uint32_t shared, non_shared, value_length;
    p = DecodeEntry(p, limit, &shared, &non_shared, &value_length);
    if (p == nullptr || key_.size() < shared) {
      CorruptionError();
      return false;
    } else {
      key_.resize(shared);
      key_.append(p, non_shared);
      value_ = Slice(p + non_shared, value_length);
      while (restart_index_ + 1 < num_restarts_ &&
             GetRestartPoint(restart_index_ + 1) < current_) {
        ++restart_index_;
      }
      return true;
    }
  }